

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  char cVar1;
  undefined8 uVar2;
  EnumType lIndex;
  ushort local_3a;
  Logger *local_38;
  ushort *puStack_30;
  code *local_28;
  code *pcStack_20;
  
  std::
  _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear(&(this->m_unflushedCount)._M_t);
  puStack_30 = &local_3a;
  local_3a = 2;
  pcStack_20 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3581:44)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3581:44)>
             ::_M_manager;
  local_38 = this;
  do {
    if (local_28 == (code *)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    cVar1 = (*pcStack_20)(&local_38);
  } while ((cVar1 == '\0') && (local_3a = local_3a * 2, local_3a < 0x81));
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return;
}

Assistant:

void initUnflushedCount(void) {
        m_unflushedCount.clear();
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
            return false;
        });
    }